

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

void * xmlCopyEntity(void *payload,xmlChar *name)

{
  xmlChar *pxVar1;
  xmlEntityPtr cur;
  xmlEntityPtr ent;
  xmlChar *name_local;
  void *payload_local;
  
  payload_local = (*xmlMalloc)(0x88);
  if (payload_local == (void *)0x0) {
    xmlEntitiesErrMemory("xmlCopyEntity:: malloc failed");
    payload_local = (void *)0x0;
  }
  else {
    memset(payload_local,0,0x88);
    *(undefined4 *)((long)payload_local + 8) = 0x11;
    *(undefined4 *)((long)payload_local + 0x5c) = *(undefined4 *)((long)payload + 0x5c);
    if (*(long *)((long)payload + 0x10) != 0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x10));
      *(xmlChar **)((long)payload_local + 0x10) = pxVar1;
    }
    if (*(long *)((long)payload + 0x60) != 0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x60));
      *(xmlChar **)((long)payload_local + 0x60) = pxVar1;
    }
    if (*(long *)((long)payload + 0x68) != 0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x68));
      *(xmlChar **)((long)payload_local + 0x68) = pxVar1;
    }
    if (*(long *)((long)payload + 0x50) != 0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x50));
      *(xmlChar **)((long)payload_local + 0x50) = pxVar1;
    }
    if (*(long *)((long)payload + 0x48) != 0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x48));
      *(xmlChar **)((long)payload_local + 0x48) = pxVar1;
    }
    if (*(long *)((long)payload + 0x78) != 0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x78));
      *(xmlChar **)((long)payload_local + 0x78) = pxVar1;
    }
  }
  return payload_local;
}

Assistant:

static void *
xmlCopyEntity(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlEntityPtr ent = (xmlEntityPtr) payload;
    xmlEntityPtr cur;

    cur = (xmlEntityPtr) xmlMalloc(sizeof(xmlEntity));
    if (cur == NULL) {
        xmlEntitiesErrMemory("xmlCopyEntity:: malloc failed");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlEntity));
    cur->type = XML_ENTITY_DECL;

    cur->etype = ent->etype;
    if (ent->name != NULL)
	cur->name = xmlStrdup(ent->name);
    if (ent->ExternalID != NULL)
	cur->ExternalID = xmlStrdup(ent->ExternalID);
    if (ent->SystemID != NULL)
	cur->SystemID = xmlStrdup(ent->SystemID);
    if (ent->content != NULL)
	cur->content = xmlStrdup(ent->content);
    if (ent->orig != NULL)
	cur->orig = xmlStrdup(ent->orig);
    if (ent->URI != NULL)
	cur->URI = xmlStrdup(ent->URI);
    return(cur);
}